

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  bool bVar2;
  anon_class_8_1_c61d8849 fileSearch;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 local_288;
  anon_class_8_1_60cb577c local_280;
  string local_278 [32];
  undefined1 local_258 [40];
  undefined1 local_230 [520];
  
  memset(local_230,0,0x208);
  local_258._0_8_ = local_230;
  std::__cxx11::string::string((string *)(local_258 + 8),(string *)name);
  local_280.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_258;
  std::__cxx11::string::string(local_278,(string *)name);
  local_288.fileMatch = (anon_class_32_1_898f2789_for__M_pred *)local_278;
  bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                    (&local_288,&this->PostExcludeFilesStrict);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_280,&this->PostIncludeRegexes);
    if (!bVar1) {
      bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                        (&local_288,&this->PostIncludeFiles);
      if (!bVar1) {
        bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_280,&this->PostExcludeRegexes);
        if (!bVar1) {
          bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                            (&local_288,&this->PostExcludeFiles);
        }
        goto LAB_004f755a;
      }
    }
    bVar2 = false;
  }
LAB_004f755a:
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  return bVar2;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}